

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame.c
# Opt level: O3

uint8_t * quicly_encode_close_frame
                    (uint8_t *base,uint64_t error_code,uint64_t offending_frame_type,
                    char *reason_phrase)

{
  size_t __n;
  long lVar1;
  ulong extraout_RAX;
  byte *pbVar2;
  byte *pbVar3;
  long lVar4;
  byte *local_40;
  byte *local_38;
  
  __n = strlen(reason_phrase);
  if (base == (uint8_t *)0x0) {
    lVar1 = 2;
    if ((0x3f < error_code) && (lVar1 = 3, 0x3fff < error_code)) {
      lVar1 = (ulong)(0x3fffffff < error_code) * 4 + 5;
    }
    if (offending_frame_type != 0xffffffffffffffff) {
      lVar4 = 1;
      if ((0x3f < offending_frame_type) && (lVar4 = 2, 0x3fff < offending_frame_type)) {
        lVar4 = (ulong)(0x3fffffff < offending_frame_type) * 4 + 4;
      }
      lVar1 = lVar1 + lVar4;
    }
    lVar4 = 1;
    if ((0x3f < __n) && (lVar4 = 2, 0x3fff < __n)) {
      lVar4 = (ulong)(0x3fffffff < __n) * 4 + 4;
    }
    lVar4 = lVar4 + lVar1;
  }
  else {
    *base = offending_frame_type == 0xffffffffffffffff | 0x1c;
    pbVar2 = base + 1;
    if (0x3f < error_code) {
      if (error_code < 0x4000) {
        base[1] = (byte)(error_code >> 8) | 0x40;
        pbVar2 = base + 2;
      }
      else {
        quicly_encode_close_frame_cold_1();
        pbVar2 = local_40;
      }
    }
    pbVar3 = pbVar2 + (1 - (long)base);
    *pbVar2 = (byte)error_code;
    if (offending_frame_type != 0xffffffffffffffff) {
      pbVar3 = base + (long)pbVar3;
      if (0x3f < offending_frame_type) {
        if (offending_frame_type < 0x4000) {
          *pbVar3 = (byte)(offending_frame_type >> 8) | 0x40;
          pbVar3 = pbVar3 + 1;
        }
        else {
          quicly_encode_close_frame_cold_2();
          pbVar3 = local_40;
        }
      }
      *pbVar3 = (byte)offending_frame_type;
      pbVar3 = pbVar3 + (1 - (long)base);
    }
    pbVar2 = base + (long)pbVar3;
    if ((__n < 0x40) ||
       (quicly_encode_close_frame_cold_3(), pbVar2 = local_40, (extraout_RAX & 1) == 0)) {
      *pbVar2 = (byte)__n;
      local_38 = pbVar2 + 1;
    }
    lVar4 = (long)local_38 - (long)base;
    memcpy(local_38,reason_phrase,__n);
  }
  return base + lVar4 + __n;
}

Assistant:

uint8_t *quicly_encode_close_frame(uint8_t *const base, uint64_t error_code, uint64_t offending_frame_type,
                                   const char *reason_phrase)
{
    size_t offset = 0, reason_phrase_len = strlen(reason_phrase);

#define PUSHV(v)                                                                                                                   \
    do {                                                                                                                           \
        if (base != NULL) {                                                                                                        \
            offset = quicly_encodev(base + offset, (v)) - base;                                                                    \
        } else {                                                                                                                   \
            offset += quicly_encodev_capacity(v);                                                                                  \
        }                                                                                                                          \
    } while (0)

    PUSHV(offending_frame_type == UINT64_MAX ? QUICLY_FRAME_TYPE_APPLICATION_CLOSE : QUICLY_FRAME_TYPE_TRANSPORT_CLOSE);
    PUSHV(error_code);
    if (offending_frame_type != UINT64_MAX)
        PUSHV(offending_frame_type);
    PUSHV(reason_phrase_len);
    if (base != NULL)
        memcpy(base + offset, reason_phrase, reason_phrase_len);
    offset += reason_phrase_len;

#undef PUSHV

    return base + offset;
}